

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_relative_path(void)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  undefined8 uVar3;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  long local_20;
  
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar1 = uv_exepath(exepath,&exepath_size);
  local_20 = (long)iVar1;
  if (local_20 == 0) {
    exepath[exepath_size] = '\0';
    __s = strrchr(exepath,0x2f);
    if (__s == (char *)0x0) {
      __s = strrchr(exepath,0x5c);
    }
    if (__s == (char *)0x0) goto LAB_001c4375;
    sVar2 = strlen(__s);
    memmove(__s + 2,__s,sVar2 + 1);
    __s[0] = '\0';
    __s[1] = '.';
    __s[2] = '/';
    options.file = __s + 1;
    options.cwd = exepath;
    *options.args = options.file;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_001c437a;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_001c4387;
    local_20 = 1;
    if (exit_cb_called != 1) goto LAB_001c4394;
    local_20 = 1;
    if (close_cb_called == 1) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      local_20 = 0;
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (local_20 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c43ae;
    }
  }
  else {
    run_test_spawn_relative_path_cold_1();
LAB_001c4375:
    run_test_spawn_relative_path_cold_7();
LAB_001c437a:
    run_test_spawn_relative_path_cold_2();
LAB_001c4387:
    run_test_spawn_relative_path_cold_3();
LAB_001c4394:
    run_test_spawn_relative_path_cold_4();
  }
  run_test_spawn_relative_path_cold_5();
LAB_001c43ae:
  plVar4 = &local_20;
  run_test_spawn_relative_path_cold_6();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_relative_path) {
  char* sep;

  init_process_options("spawn_helper1", exit_cb);

  exepath_size = sizeof(exepath) - 2;
  ASSERT_OK(uv_exepath(exepath, &exepath_size));
  exepath[exepath_size] = '\0';

  /* Poor man's basename(3). */
  sep = strrchr(exepath, '/');
  if (sep == NULL)
    sep = strrchr(exepath, '\\');
  ASSERT_NOT_NULL(sep);

  /* Split into dirname and basename and make basename relative. */
  memmove(sep + 2, sep, 1 + strlen(sep));
  sep[0] = '\0';
  sep[1] = '.';
  sep[2] = '/';

  options.cwd = exepath;
  options.file = options.args[0] = sep + 1;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}